

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::Double
          (Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,double d)

{
  bool bVar1;
  U local_28;
  Number n;
  double d_local;
  Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  if (0.0 <= d) {
    local_28.u = (long)d | (long)(d - 9.223372036854776e+18) & (long)d >> 0x3f;
  }
  else {
    local_28.u = (uint64_t)d;
  }
  n.u = (U)d;
  n.d = d;
  bVar1 = WriteNumber(this,(Number *)&local_28);
  return bVar1;
}

Assistant:

bool Double(double d) {
        Number n;
        if (d < 0) n.u.i = static_cast<int64_t>(d);
        else       n.u.u = static_cast<uint64_t>(d);
        n.d = d;
        return WriteNumber(n);
    }